

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.cpp
# Opt level: O0

void __thiscall Actions::emplace(Actions *this,ActionType type,int target_id,Vec2 pos)

{
  undefined1 local_30 [8];
  Action act;
  int target_id_local;
  ActionType type_local;
  Actions *this_local;
  Vec2 pos_local;
  
  act.pos.x = (float)target_id;
  act.pos.y = (float)type;
  Action::Action((Action *)local_30,type);
  local_30._4_4_ = act.pos.x;
  act._0_8_ = pos;
  std::vector<Action,_std::allocator<Action>_>::push_back(&this->actions,(value_type *)local_30);
  return;
}

Assistant:

void Actions::emplace(ActionType type, int target_id, Vec2 pos)
{
    Action act(type);
    act.target_id = target_id;
    act.pos = pos;
    actions.push_back(act);
}